

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_UndeclaredVariableAccessInAssignmentThrows_Test::
~SemanticAnalyserTest_UndeclaredVariableAccessInAssignmentThrows_Test
          (SemanticAnalyserTest_UndeclaredVariableAccessInAssignmentThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredVariableAccessInAssignmentThrows)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: f32 = 42;
    x = 2*y;
    ret 0;
  }
  )SRC";
  throwTest(source);
}